

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::SetRed
          (InstructionDisassembler *this,ostream *stream)

{
  char *pcVar1;
  red local_9;
  
  if (this->color_ == true) {
    local_9.isPrint = this->print_;
    pcVar1 = clr::red::operator_cast_to_char_(&local_9);
    std::operator<<(stream,pcVar1);
  }
  return;
}

Assistant:

void InstructionDisassembler::SetRed(std::ostream& stream) const {
  if (color_) stream << spvtools::clr::red{print_};
}